

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wast-parser.cc
# Opt level: O2

Result __thiscall
wabt::WastParser::ParseBoundValueTypeList
          (WastParser *this,TokenType token,TypeVector *types,BindingHash *bindings,
          Index binding_index_offset)

{
  bool bVar1;
  Result RVar2;
  Type type;
  string name;
  undefined4 local_78;
  undefined4 uStack_74;
  undefined4 uStack_70;
  undefined4 uStack_6c;
  int local_68;
  int iStack_64;
  int iStack_60;
  undefined4 uStack_5c;
  int local_58;
  Location loc;
  
  do {
    bVar1 = MatchLpar(this,token);
    if (!bVar1) {
      return (Result)Ok;
    }
    bVar1 = PeekMatch(this,Last_String);
    if (bVar1) {
      name._M_dataplus._M_p = (pointer)&name.field_2;
      name._M_string_length = 0;
      name.field_2._M_local_buf[0] = '\0';
      GetLocation(&loc,this);
      ParseBindVarOpt(this,&name);
      RVar2 = ParseValueType(this,&type);
      if (RVar2.enum_ == Error) {
        std::__cxx11::string::_M_dispose();
        return (Result)Error;
      }
      local_58 = (int)((ulong)((long)(types->
                                     super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>).
                                     _M_impl.super__Vector_impl_data._M_finish -
                              (long)(types->
                                    super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>).
                                    _M_impl.super__Vector_impl_data._M_start) >> 2) +
                 binding_index_offset;
      local_68 = loc.field_1.field_0.line;
      iStack_64 = loc.field_1.field_0.first_column;
      iStack_60 = loc.field_1.field_0.last_column;
      uStack_5c = loc.field_1._12_4_;
      local_78 = loc.filename.data_._0_4_;
      uStack_74 = loc.filename.data_._4_4_;
      uStack_70 = (undefined4)loc.filename.size_;
      uStack_6c = loc.filename.size_._4_4_;
      std::
      _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,wabt::Binding>,std::allocator<std::pair<std::__cxx11::string_const,wabt::Binding>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,false>>
      ::_M_emplace<std::__cxx11::string&,wabt::Binding>
                ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,wabt::Binding>,std::allocator<std::pair<std::__cxx11::string_const,wabt::Binding>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,false>>
                  *)bindings,&name,&local_78);
      std::vector<wabt::Type,_std::allocator<wabt::Type>_>::push_back(types,&type);
      std::__cxx11::string::_M_dispose();
    }
    else {
      RVar2 = ParseValueTypeList(this,types);
      if (RVar2.enum_ == Error) {
        return (Result)Error;
      }
    }
    RVar2 = Expect(this,Rpar);
  } while (RVar2.enum_ != Error);
  return (Result)Error;
}

Assistant:

Result WastParser::ParseBoundValueTypeList(TokenType token,
                                           TypeVector* types,
                                           BindingHash* bindings,
                                           Index binding_index_offset) {
  WABT_TRACE(ParseBoundValueTypeList);
  while (MatchLpar(token)) {
    if (PeekMatch(TokenType::Var)) {
      std::string name;
      Type type;
      Location loc = GetLocation();
      ParseBindVarOpt(&name);
      CHECK_RESULT(ParseValueType(&type));
      bindings->emplace(name,
                        Binding(loc, binding_index_offset + types->size()));
      types->push_back(type);
    } else {
      CHECK_RESULT(ParseValueTypeList(types));
    }
    EXPECT(Rpar);
  }
  return Result::Ok;
}